

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O0

string_view __thiscall wabt::GetBasename(wabt *this,string_view filename)

{
  unsigned_long *puVar1;
  size_type local_38;
  size_t last_backslash;
  size_t last_slash;
  string_view filename_local;
  char *local_10;
  
  filename_local.data_ = filename.data_;
  last_slash = (size_t)this;
  last_backslash = string_view::find_last_of((string_view *)&last_slash,'/',0xffffffffffffffff);
  local_38 = string_view::find_last_of((string_view *)&last_slash,'\\',0xffffffffffffffff);
  if ((last_backslash == 0xffffffffffffffff) && (local_38 == 0xffffffffffffffff)) {
    local_10 = filename_local.data_;
    filename_local.size_ = last_slash;
  }
  else {
    if (last_backslash == 0xffffffffffffffff) {
      last_backslash = local_38;
      if (local_38 == 0xffffffffffffffff) {
        local_10 = filename_local.data_;
        filename_local.size_ = last_slash;
        return stack0xffffffffffffffe8;
      }
    }
    else if (local_38 != 0xffffffffffffffff) {
      puVar1 = std::max<unsigned_long>(&last_backslash,&local_38);
      last_backslash = *puVar1;
    }
    join_0x00000010_0x00000000_ =
         string_view::substr((string_view *)&last_slash,last_backslash + 1,0xffffffffffffffff);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

string_view GetBasename(string_view filename) {
  size_t last_slash = filename.find_last_of('/');
  size_t last_backslash = filename.find_last_of('\\');
  if (last_slash == string_view::npos && last_backslash == string_view::npos) {
    return filename;
  }

  if (last_slash == string_view::npos) {
    if (last_backslash == string_view::npos) {
      return filename;
    }
    last_slash = last_backslash;
  } else if (last_backslash != string_view::npos) {
    last_slash = std::max(last_slash, last_backslash);
  }

  return filename.substr(last_slash + 1);
}